

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O1

int lj_carith_op(lua_State *L,MMS mm)

{
  long *plVar1;
  ushort uVar2;
  CType *pCVar3;
  bool bVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  CTypeID CVar8;
  CTSize CVar9;
  CType *pCVar10;
  cTValue *tv;
  void *pvVar11;
  long lVar12;
  GCstr *pGVar13;
  ulong uVar14;
  uint uVar15;
  TValue *pTVar16;
  ulong uVar17;
  TValue TVar18;
  ulong uVar19;
  uint uVar20;
  ErrMsg em;
  undefined4 in_register_00000034;
  CTState *cts;
  uint8_t *puVar21;
  CType *pCVar22;
  MMS mm_00;
  ulong uVar23;
  bool bVar24;
  uint64_t u0;
  CDArith ca;
  ulong local_78;
  int local_6c;
  ulong local_68 [2];
  uint8_t *local_58 [2];
  CType *local_48 [2];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,mm);
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pTVar16 = L->base;
  if (L->top <= pTVar16 + 1) {
    lj_err_argt(L,1,10);
  }
  local_6c = 1;
  lVar12 = 0;
  do {
    pCVar22 = local_48[0];
    uVar15 = (pTVar16->field_2).it;
    if (uVar15 == 0xfffffff5) {
      uVar2 = *(ushort *)((ulong)(pTVar16->u32).lo + 6);
      pCVar3 = cts->tab;
      TVar18.u64 = (ulong)(pTVar16->u32).lo + 8;
      uVar15 = pCVar3[uVar2].info >> 0x1c;
      if (uVar15 == 6) {
        TVar18.u64 = *TVar18.u64;
        CVar8 = lj_ctype_intern(cts,uVar2 | 0x20030000,8);
        pCVar10 = cts->tab + CVar8;
        if (lVar12 != 0) {
          local_48[0] = (CType *)((long)&cts->tab->info +
                                 ((long)pCVar22 - (long)pCVar3 & 0xffffffff0U));
        }
      }
      else {
        pCVar10 = pCVar3 + uVar2;
        if (uVar15 == 2) {
          if (pCVar10->size == 4) {
            puVar5 = &((anon_struct_8_2_f9ee98fb_for_u32 *)TVar18.u64)->lo;
            TVar18.field_2.it = 0;
            TVar18.field_2.field_0 =
                 (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)*puVar5;
          }
          else {
            TVar18.u64 = *TVar18.u64;
          }
          if ((pCVar3[uVar2].info & 0xf0800000) == 0x20800000) {
            pCVar10 = pCVar3 + (ushort)pCVar10->info;
          }
        }
      }
      if ((pCVar10->info & 0xf0000000) == 0x50000000) {
        pCVar10 = (CType *)((long)&cts->tab->info + (ulong)((pCVar10->info & 0xffff) << 4));
      }
LAB_0014e37d:
      local_48[lVar12] = pCVar10;
      local_58[lVar12] = (uint8_t *)TVar18;
    }
    else {
      if (uVar15 < 0xfffeffff) {
        pCVar10 = cts->tab + 0xe;
        TVar18 = (TValue)pTVar16;
        goto LAB_0014e37d;
      }
      if (uVar15 != 0xfffffffb) {
        if (uVar15 == 0xffffffff) {
          pCVar10 = cts->tab + 0x11;
          TVar18 = (TValue)0x0;
        }
        else {
          pCVar10 = (CType *)0x0;
          TVar18 = (TValue)0x1;
          local_6c = 0;
        }
        goto LAB_0014e37d;
      }
      uVar2 = *(ushort *)((ulong)pTVar16[(ulong)(lVar12 == 0) * 2 + -1].u32.lo + 6);
      pCVar22 = cts->tab;
      uVar15 = pCVar22[uVar2].info;
      local_48[lVar12] = (CType *)0x0;
      local_58[lVar12] = (uint8_t *)((ulong)(pTVar16->u32).lo + 0x10);
      if ((uVar15 & 0xf0000000) == 0x50000000) {
        pCVar22 = pCVar22 + uVar2;
        pCVar10 = lj_ctype_getfieldq(cts,pCVar22,(GCstr *)(ulong)(pTVar16->u32).lo,
                                     (CTSize *)local_68,(CTInfo *)0x0);
        if ((pCVar10 == (CType *)0x0) || ((pCVar10->info & 0xf0000000) != 0xb0000000)) {
          uVar17 = (ulong)(uint)((1 - (int)lVar12) * 8);
          *(CType **)((long)local_48 + uVar17) = pCVar22;
          *(undefined8 *)((long)local_58 + uVar17) = 0;
          local_6c = 0;
          bVar24 = false;
        }
        else {
          local_48[lVar12] =
               (CType *)((long)&cts->tab->info + (ulong)((pCVar10->info & 0xffff) << 4));
          local_58[lVar12] = (uint8_t *)&pCVar10->size;
          bVar24 = true;
          local_6c = 1;
        }
      }
      else {
        bVar24 = true;
        local_6c = 0;
      }
      if (!bVar24) break;
    }
    pTVar16 = pTVar16 + 1;
    bVar24 = lVar12 == 0;
    lVar12 = lVar12 + 1;
  } while (bVar24);
  pCVar22 = local_48[0];
  puVar6 = local_58[1];
  puVar21 = local_58[0];
  mm_00 = (MMS)local_38;
  if (((local_6c == 0) || (mm_00 == MM_FAST)) || (mm_00 == MM_concat)) goto LAB_0014e3f2;
  if (((local_48[0]->info < 0x10000000) && (local_48[0]->size < 9)) &&
     ((local_48[1]->info < 0x10000000 && (local_48[1]->size < 9)))) {
    iVar7 = 0xc;
    if ((((byte)(local_48[0]->info >> 0x17) & local_48[0]->size == 8) == 0) &&
       (iVar7 = 0xb, (local_48[1]->info >> 0x17 & 1) != 0)) {
      iVar7 = (local_48[1]->size == 8) + 0xb;
    }
    pCVar22 = (CType *)((long)&cts->tab->info + (ulong)(uint)(iVar7 << 4));
    lj_cconv_ct_ct(cts,pCVar22,local_48[0],(uint8_t *)local_68,local_58[0],0);
    if (mm_00 != MM_unm) {
      lj_cconv_ct_ct(cts,pCVar22,local_48[1],(uint8_t *)&local_78,local_58[1],0);
      if (mm_00 == MM_le) {
        bVar4 = (long)local_68[0] <= (long)local_78;
        bVar24 = local_68[0] <= local_78;
LAB_0014e8e1:
        if (iVar7 == 0xb) {
          bVar24 = bVar4;
        }
        iVar7 = -2 - (uint)bVar24;
      }
      else {
        if (mm_00 == MM_lt) {
          bVar24 = local_68[0] < local_78;
          bVar4 = (long)local_68[0] < (long)local_78;
          goto LAB_0014e8e1;
        }
        if (mm_00 != MM_eq) goto LAB_0014e586;
        iVar7 = (local_68[0] != local_78) - 3;
      }
      *(int *)((long)L->top + -4) = iVar7;
      goto LAB_0014ea16;
    }
LAB_0014e586:
    pvVar11 = lj_mem_newgco(cts->L,0x10);
    *(undefined1 *)((long)pvVar11 + 5) = 10;
    *(short *)((long)pvVar11 + 6) = (short)iVar7;
    plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
    *plVar1 = *plVar1 + 1;
    pTVar16 = L->top;
    pTVar16[-1].u32.lo = (uint32_t)pvVar11;
    *(undefined4 *)((long)pTVar16 + -4) = 0xfffffff5;
    switch(mm_00) {
    case MM_add:
      uVar17 = local_78 + local_68[0];
      break;
    case MM_sub:
      uVar17 = local_68[0] - local_78;
      break;
    case MM_mul:
      uVar17 = local_78 * local_68[0];
      break;
    case MM_div:
      uVar17 = 0x8000000000000000;
      if (iVar7 == 0xb) {
        if ((local_78 != 0) && (local_78 != 0xffffffffffffffff || local_68[0] != 0x8000000000000000)
           ) {
          uVar17 = (long)local_68[0] / (long)local_78;
        }
      }
      else if (local_78 != 0) {
        uVar17 = local_68[0] / local_78;
      }
      break;
    case MM_mod:
      if (iVar7 == 0xb) {
        uVar17 = 0x8000000000000000;
        if (local_78 != 0) {
          if (local_78 == 0xffffffffffffffff && local_68[0] == 0x8000000000000000) {
            uVar17 = 0;
          }
          else {
            uVar17 = (long)local_68[0] % (long)local_78;
          }
        }
      }
      else if (local_78 == 0) {
        uVar17 = 0x8000000000000000;
      }
      else {
        uVar17 = local_68[0] % local_78;
      }
      break;
    case MM_pow:
      if (iVar7 == 0xb) {
        uVar17 = lj_carith_powi64(local_68[0],local_78);
      }
      else {
        uVar17 = lj_carith_powu64(local_68[0],local_78);
      }
      break;
    case MM_unm:
      uVar17 = -local_68[0];
      break;
    default:
      goto switchD_0014e5dc_default;
    }
    *(ulong *)((long)pvVar11 + 8) = uVar17;
  }
  else {
    uVar15 = local_48[0]->info;
    if ((uVar15 & 0xf0000000) == 0x20000000 || (uVar15 & 0xfc000000) == 0x30000000) {
      if (((mm_00 < MM_mul) && ((0x8d0U >> (mm_00 & (MM_unm|MM_pow)) & 1) != 0)) &&
         ((local_48[1]->info & 0xf0000000) == 0x20000000 ||
          (local_48[1]->info & 0xfc000000) == 0x30000000)) {
        if (mm_00 != MM_eq) {
          iVar7 = lj_cconv_compatptr(cts,local_48[0],local_48[1],8);
          if (iVar7 != 0) {
            if (mm_00 == MM_sub) {
              CVar9 = lj_ctype_size(cts,(uint)(ushort)pCVar22->info);
              if (CVar9 + 1 < 2) goto LAB_0014e3f2;
              L->top[-1].n = (double)(int)(((long)puVar21 - (long)puVar6) / (long)(int)CVar9);
            }
            else {
              if (mm_00 == MM_lt) {
                iVar7 = -2 - (uint)(puVar21 < puVar6);
              }
              else {
                iVar7 = (puVar6 < puVar21) - 3;
              }
              *(int *)((long)L->top + -4) = iVar7;
            }
            goto LAB_0014ea16;
          }
          goto LAB_0014e3f2;
        }
        *(uint *)((long)L->top + -4) = (local_58[0] != local_58[1]) - 3;
        goto LAB_0014ea16;
      }
      if (((mm_00 & ~MM_newindex) != MM_add) || (0xfffffff < local_48[1]->info)) goto LAB_0014e3f2;
      lj_cconv_ct_ct(cts,cts->tab + 0xb,local_48[1],(uint8_t *)local_68,local_58[1],0);
      if (mm_00 == MM_sub) {
        local_68[0] = -local_68[0];
      }
    }
    else {
      if ((0xfffffff < uVar15 || mm_00 != MM_add) ||
         ((local_48[1]->info & 0xf0000000) != 0x20000000 &&
          (local_48[1]->info & 0xfc000000) != 0x30000000)) goto LAB_0014e3f2;
      lj_cconv_ct_ct(cts,cts->tab + 0xb,local_48[0],(uint8_t *)local_68,local_58[0],0);
      mm_00 = (MMS)local_38;
      puVar21 = puVar6;
      pCVar22 = local_48[1];
    }
    CVar9 = lj_ctype_size(cts,(uint)(ushort)pCVar22->info);
    if (CVar9 == 0xffffffff) {
LAB_0014e3f2:
      if ((L->base->field_2).it == 0xfffffff5) {
        uVar2 = *(ushort *)((ulong)(L->base->u32).lo + 6);
        uVar15 = cts->tab[uVar2].info;
        uVar20 = (uint)uVar2;
        if ((uVar15 & 0xf0000000) == 0x20000000) {
          uVar20 = uVar15 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar20,mm_00);
      }
      else {
        tv = (cTValue *)0x0;
      }
      if (tv == (cTValue *)0x0) {
        pTVar16 = L->base + 1;
        if ((pTVar16 < L->top) && (*(int *)((long)L->base + 0xc) == -0xb)) {
          uVar2 = *(ushort *)((ulong)(pTVar16->u32).lo + 6);
          uVar15 = cts->tab[uVar2].info;
          uVar20 = (uint)uVar2;
          if ((uVar15 & 0xf0000000) == 0x20000000) {
            uVar20 = uVar15 & 0xffff;
          }
          tv = lj_ctype_meta(cts,uVar20,mm_00);
        }
        else {
          tv = (cTValue *)0x0;
        }
      }
      if (tv == (cTValue *)0x0) {
        if (mm_00 == MM_eq) {
          iVar7 = (local_58[0] != local_58[1]) - 3;
          *(int *)((long)L->top + -4) = iVar7;
          *(int *)((ulong)(L->glref).ptr32 + 0x124) = iVar7;
          return 1;
        }
        uVar17 = 0xffffffff;
        uVar23 = 0;
        uVar19 = 0xffffffff;
        do {
          pCVar22 = local_48[uVar23];
          if ((pCVar22 == (CType *)0x0) || (*(int *)((long)L->base + uVar23 * 8 + 4) != -0xb)) {
            uVar15 = *(uint *)((long)L->base + uVar23 * 8 + 4);
            if (uVar15 == 0xfffffffb) {
              uVar17 = uVar23 & 0xffffffff;
            }
            uVar14 = 0xd;
            if ((0xfffeffff < uVar15) && (uVar14 = 3, (uVar15 & 0xffff8000) != 0xffff0000)) {
              uVar14 = (ulong)~uVar15;
            }
            pGVar13 = (GCstr *)lj_obj_itypename[uVar14];
          }
          else {
            if ((pCVar22->info & 0xf0000000) == 0x50000000) {
              uVar19 = uVar23 & 0xffffffff;
            }
            pGVar13 = lj_ctype_repr(L,(CTypeID)((ulong)((long)pCVar22 - (long)cts->tab) >> 4),
                                    (GCstr *)0x0);
            pGVar13 = pGVar13 + 1;
          }
          local_68[uVar23] = (ulong)pGVar13;
          uVar23 = uVar23 + 1;
        } while (uVar23 == 1);
        if (((uint)uVar17 ^ (uint)uVar19) == 1) {
          local_68[1] = local_68[(int)(uint)uVar19];
          uVar17 = local_68[(int)(uint)uVar17];
          em = LJ_ERR_FFI_BADCONV;
        }
        else {
          uVar17 = local_68[0];
          if ((uint)local_38 == 5) {
            em = LJ_ERR_FFI_BADLEN;
          }
          else if ((uint)local_38 == 8) {
            em = LJ_ERR_FFI_BADCONCAT;
          }
          else {
            em = LJ_ERR_FFI_BADARITH;
            if ((uint)local_38 < 10) {
              em = LJ_ERR_FFI_BADCOMP;
            }
          }
        }
        lj_err_callerv(L,em,uVar17,local_68[1]);
      }
      iVar7 = lj_meta_tailcall(L,tv);
      return iVar7;
    }
    lVar12 = (long)(int)CVar9 * local_68[0];
    CVar8 = lj_ctype_intern(cts,(ushort)pCVar22->info | 0x20030000,8);
    pvVar11 = lj_mem_newgco(cts->L,0x10);
    *(undefined1 *)((long)pvVar11 + 5) = 10;
    *(short *)((long)pvVar11 + 6) = (short)CVar8;
    plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
    *plVar1 = *plVar1 + 1;
    *(uint8_t **)((long)pvVar11 + 8) = puVar21 + lVar12;
    pTVar16 = L->top;
    pTVar16[-1].u32.lo = (uint32_t)pvVar11;
    *(undefined4 *)((long)pTVar16 + -4) = 0xfffffff5;
  }
switchD_0014e5dc_default:
  uVar17 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar17 + 0x54) <= *(uint *)(uVar17 + 0x50)) {
    lj_gc_step(L);
  }
LAB_0014ea16:
  *(TValue *)((ulong)(L->glref).ptr32 + 0x120) = L->top[-1];
  return 1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}